

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns_core.c
# Opt level: O2

void FeatureParameterExtraction(NoiseSuppressionC *self,int flag)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  if (flag == 0) {
    fVar20 = self->featureData[3];
    if ((0.0 <= fVar20) &&
       (fVar16 = (self->featureExtractionParams).binSizeLrt, fVar20 < fVar16 * 1000.0)) {
      self->histLrt[(int)(fVar20 / fVar16)] = self->histLrt[(int)(fVar20 / fVar16)] + 1;
    }
    fVar20 = self->featureData[0];
    if ((0.0 <= fVar20) &&
       (fVar16 = (self->featureExtractionParams).binSizeSpecFlat, fVar20 < fVar16 * 1000.0)) {
      self->histSpecFlat[(int)(fVar20 / fVar16)] = self->histSpecFlat[(int)(fVar20 / fVar16)] + 1;
    }
    fVar20 = self->featureData[4];
    if ((0.0 <= fVar20) &&
       (fVar16 = (self->featureExtractionParams).binSizeSpecDiff, fVar20 < fVar16 * 1000.0)) {
      self->histSpecDiff[(int)(fVar20 / fVar16)] = self->histSpecDiff[(int)(fVar20 / fVar16)] + 1;
    }
  }
  else if (flag == 1) {
    fVar16 = 0.0;
    fVar17 = 0.0;
    fVar20 = 0.0;
    iVar3 = 0;
    for (lVar8 = 0; lVar8 != 1000; lVar8 = lVar8 + 1) {
      fVar21 = ((float)(int)lVar8 + 0.5) * (self->featureExtractionParams).binSizeLrt;
      iVar12 = self->histLrt[lVar8];
      fVar25 = (float)iVar12;
      fVar22 = fVar25 * fVar21;
      if ((self->featureExtractionParams).rangeAvgHistLrt < fVar21) {
        iVar12 = 0;
      }
      else {
        fVar20 = fVar20 + fVar22;
      }
      iVar3 = iVar3 + iVar12;
      fVar16 = fVar16 + fVar21 * fVar22;
      fVar17 = fVar17 + fVar21 * fVar25;
    }
    if (0 < iVar3) {
      fVar20 = fVar20 / (float)iVar3;
    }
    fVar21 = fVar16 / (float)self->modelUpdatePars[1] -
             (fVar17 / (float)self->modelUpdatePars[1]) * fVar20;
    fVar16 = (self->featureExtractionParams).thresFluctLrt;
    if (fVar21 < fVar16) {
      self->priorModelPars[0] = (self->featureExtractionParams).maxLrt;
    }
    else {
      fVar20 = fVar20 * (self->featureExtractionParams).factor1ModelPars;
      self->priorModelPars[0] = fVar20;
      fVar22 = (self->featureExtractionParams).minLrt;
      if (fVar20 < fVar22) {
        self->priorModelPars[0] = fVar22;
        fVar20 = fVar22;
      }
      fVar22 = (self->featureExtractionParams).maxLrt;
      if (fVar22 < fVar20) {
        self->priorModelPars[0] = fVar22;
      }
    }
    fVar20 = 0.0;
    iVar4 = 0;
    fVar22 = 0.0;
    iVar3 = 0;
    iVar12 = 0;
    iVar7 = 0;
    for (lVar8 = 0; lVar8 != 1000; lVar8 = lVar8 + 1) {
      fVar23 = ((float)(int)lVar8 + 0.5) * (self->featureExtractionParams).binSizeSpecFlat;
      iVar11 = self->histSpecFlat[lVar8];
      fVar25 = fVar20;
      fVar24 = fVar23;
      iVar13 = iVar3;
      iVar10 = iVar4;
      iVar14 = iVar11;
      iVar15 = iVar11;
      if ((iVar11 <= iVar4) &&
         (fVar25 = fVar22, fVar24 = fVar20, iVar13 = iVar7, iVar10 = iVar12, iVar14 = iVar4,
         iVar15 = iVar3, iVar12 < iVar11)) {
        fVar25 = fVar23;
        iVar13 = iVar11;
        iVar10 = iVar11;
      }
      iVar4 = iVar14;
      fVar20 = fVar24;
      fVar22 = fVar25;
      iVar3 = iVar15;
      iVar12 = iVar10;
      iVar7 = iVar13;
    }
    fVar25 = 0.0;
    iVar13 = 0;
    fVar24 = 0.0;
    iVar12 = 0;
    iVar4 = 0;
    iVar11 = 0;
    for (lVar8 = 0; lVar8 != 1000; lVar8 = lVar8 + 1) {
      fVar26 = ((float)(int)lVar8 + 0.5) * (self->featureExtractionParams).binSizeSpecDiff;
      iVar10 = self->histSpecDiff[lVar8];
      fVar23 = fVar25;
      fVar1 = fVar26;
      iVar14 = iVar13;
      iVar15 = iVar4;
      iVar2 = iVar10;
      iVar9 = iVar10;
      if ((iVar10 <= iVar13) &&
         (fVar23 = fVar24, fVar1 = fVar25, iVar14 = iVar12, iVar15 = iVar11, iVar2 = iVar13,
         iVar9 = iVar4, iVar12 < iVar10)) {
        fVar23 = fVar26;
        iVar14 = iVar10;
        iVar15 = iVar10;
      }
      iVar13 = iVar2;
      fVar25 = fVar1;
      fVar24 = fVar23;
      iVar12 = iVar14;
      iVar4 = iVar9;
      iVar11 = iVar15;
    }
    if ((ABS(fVar22 - fVar20) < (self->featureExtractionParams).limitPeakSpacingSpecFlat) &&
       ((float)iVar3 * (self->featureExtractionParams).limitPeakWeightsSpecFlat < (float)iVar7)) {
      iVar3 = iVar3 + iVar7;
      fVar20 = (fVar20 + fVar22) * 0.5;
    }
    bVar6 = 0;
    if (((self->featureExtractionParams).thresWeightSpecFlat <= iVar3) &&
       (bVar6 = 0, (self->featureExtractionParams).thresPosSpecFlat <= fVar20)) {
      fVar20 = fVar20 * (self->featureExtractionParams).factor2ModelPars;
      self->priorModelPars[1] = fVar20;
      fVar22 = (self->featureExtractionParams).minSpecFlat;
      if (fVar20 < fVar22) {
        self->priorModelPars[1] = fVar22;
        fVar20 = fVar22;
      }
      fVar22 = (self->featureExtractionParams).maxSpecFlat;
      bVar6 = 1;
      if (fVar22 < fVar20) {
        self->priorModelPars[1] = fVar22;
      }
    }
    if ((ABS(fVar24 - fVar25) < (self->featureExtractionParams).limitPeakSpacingSpecDiff) &&
       ((float)iVar4 * (self->featureExtractionParams).limitPeakWeightsSpecDiff < (float)iVar11)) {
      iVar4 = iVar4 + iVar11;
      fVar25 = (fVar25 + fVar24) * 0.5;
    }
    fVar25 = fVar25 * (self->featureExtractionParams).factor1ModelPars;
    self->priorModelPars[3] = fVar25;
    fVar20 = (self->featureExtractionParams).minSpecDiff;
    if (fVar25 < fVar20) {
      self->priorModelPars[3] = fVar20;
      fVar25 = fVar20;
    }
    iVar3 = (self->featureExtractionParams).thresWeightSpecDiff;
    fVar20 = (self->featureExtractionParams).maxSpecDiff;
    if (fVar20 < fVar25) {
      self->priorModelPars[3] = fVar20;
    }
    bVar5 = fVar16 <= fVar21 && iVar3 <= iVar4;
    fVar20 = (float)(byte)(bVar6 + bVar5 + 1);
    auVar18._4_4_ = (float)bVar6;
    auVar18._0_4_ = 0x3f800000;
    auVar18._8_8_ = 0;
    auVar19._4_4_ = fVar20;
    auVar19._0_4_ = fVar20;
    auVar19._8_4_ = fVar17;
    auVar19._12_4_ = fVar17;
    auVar19 = divps(auVar18,auVar19);
    *(long *)(self->priorModelPars + 4) = auVar19._0_8_;
    self->priorModelPars[6] = (float)bVar5 / fVar20;
    if (0 < self->modelUpdatePars[0]) {
      for (lVar8 = -4000; lVar8 != 0; lVar8 = lVar8 + 4) {
        *(undefined4 *)((long)self->histSpecFlat + lVar8) = 0;
        *(undefined4 *)((long)self->histSpecDiff + lVar8) = 0;
        *(undefined4 *)((long)self->speechProb + lVar8) = 0;
      }
    }
  }
  return;
}

Assistant:

static void FeatureParameterExtraction(NoiseSuppressionC* self, int flag) {
  int i, useFeatureSpecFlat, useFeatureSpecDiff, numHistLrt;
  int maxPeak1, maxPeak2;
  int weightPeak1SpecFlat, weightPeak2SpecFlat, weightPeak1SpecDiff,
      weightPeak2SpecDiff;

  float binMid, featureSum;
  float posPeak1SpecFlat, posPeak2SpecFlat, posPeak1SpecDiff, posPeak2SpecDiff;
  float fluctLrt, avgHistLrt, avgSquareHistLrt, avgHistLrtCompl;

  // 3 features: LRT, flatness, difference.
  // lrt_feature = self->featureData[3];
  // flat_feature = self->featureData[0];
  // diff_feature = self->featureData[4];

  // Update histograms.
  if (flag == 0) {
    // LRT
    if ((self->featureData[3] <
         HIST_PAR_EST * self->featureExtractionParams.binSizeLrt) &&
        (self->featureData[3] >= 0.0)) {
      i = (int)(self->featureData[3] /
                self->featureExtractionParams.binSizeLrt);
      self->histLrt[i]++;
    }
    // Spectral flatness.
    if ((self->featureData[0] <
         HIST_PAR_EST * self->featureExtractionParams.binSizeSpecFlat) &&
        (self->featureData[0] >= 0.0)) {
      i = (int)(self->featureData[0] /
                self->featureExtractionParams.binSizeSpecFlat);
      self->histSpecFlat[i]++;
    }
    // Spectral difference.
    if ((self->featureData[4] <
         HIST_PAR_EST * self->featureExtractionParams.binSizeSpecDiff) &&
        (self->featureData[4] >= 0.0)) {
      i = (int)(self->featureData[4] /
                self->featureExtractionParams.binSizeSpecDiff);
      self->histSpecDiff[i]++;
    }
  }

  // Extract parameters for speech/noise probability.
  if (flag == 1) {
    // LRT feature: compute the average over
    // self->featureExtractionParams.rangeAvgHistLrt.
    avgHistLrt = 0.0;
    avgHistLrtCompl = 0.0;
    avgSquareHistLrt = 0.0;
    numHistLrt = 0;
    for (i = 0; i < HIST_PAR_EST; i++) {
      binMid = ((float)i + 0.5f) * self->featureExtractionParams.binSizeLrt;
      if (binMid <= self->featureExtractionParams.rangeAvgHistLrt) {
        avgHistLrt += self->histLrt[i] * binMid;
        numHistLrt += self->histLrt[i];
      }
      avgSquareHistLrt += self->histLrt[i] * binMid * binMid;
      avgHistLrtCompl += self->histLrt[i] * binMid;
    }
    if (numHistLrt > 0) {
      avgHistLrt = avgHistLrt / ((float)numHistLrt);
    }
    avgHistLrtCompl = avgHistLrtCompl / ((float)self->modelUpdatePars[1]);
    avgSquareHistLrt = avgSquareHistLrt / ((float)self->modelUpdatePars[1]);
    fluctLrt = avgSquareHistLrt - avgHistLrt * avgHistLrtCompl;
    // Get threshold for LRT feature.
    if (fluctLrt < self->featureExtractionParams.thresFluctLrt) {
      // Very low fluctuation, so likely noise.
      self->priorModelPars[0] = self->featureExtractionParams.maxLrt;
    } else {
      self->priorModelPars[0] =
          self->featureExtractionParams.factor1ModelPars * avgHistLrt;
      // Check if value is within min/max range.
      if (self->priorModelPars[0] < self->featureExtractionParams.minLrt) {
        self->priorModelPars[0] = self->featureExtractionParams.minLrt;
      }
      if (self->priorModelPars[0] > self->featureExtractionParams.maxLrt) {
        self->priorModelPars[0] = self->featureExtractionParams.maxLrt;
      }
    }
    // Done with LRT feature.

    // For spectral flatness and spectral difference: compute the main peaks of
    // histogram.
    maxPeak1 = 0;
    maxPeak2 = 0;
    posPeak1SpecFlat = 0.0;
    posPeak2SpecFlat = 0.0;
    weightPeak1SpecFlat = 0;
    weightPeak2SpecFlat = 0;

    // Peaks for flatness.
    for (i = 0; i < HIST_PAR_EST; i++) {
      binMid =
          (i + 0.5f) * self->featureExtractionParams.binSizeSpecFlat;
      if (self->histSpecFlat[i] > maxPeak1) {
        // Found new "first" peak.
        maxPeak2 = maxPeak1;
        weightPeak2SpecFlat = weightPeak1SpecFlat;
        posPeak2SpecFlat = posPeak1SpecFlat;

        maxPeak1 = self->histSpecFlat[i];
        weightPeak1SpecFlat = self->histSpecFlat[i];
        posPeak1SpecFlat = binMid;
      } else if (self->histSpecFlat[i] > maxPeak2) {
        // Found new "second" peak.
        maxPeak2 = self->histSpecFlat[i];
        weightPeak2SpecFlat = self->histSpecFlat[i];
        posPeak2SpecFlat = binMid;
      }
    }

    // Compute two peaks for spectral difference.
    maxPeak1 = 0;
    maxPeak2 = 0;
    posPeak1SpecDiff = 0.0;
    posPeak2SpecDiff = 0.0;
    weightPeak1SpecDiff = 0;
    weightPeak2SpecDiff = 0;
    // Peaks for spectral difference.
    for (i = 0; i < HIST_PAR_EST; i++) {
      binMid =
          ((float)i + 0.5f) * self->featureExtractionParams.binSizeSpecDiff;
      if (self->histSpecDiff[i] > maxPeak1) {
        // Found new "first" peak.
        maxPeak2 = maxPeak1;
        weightPeak2SpecDiff = weightPeak1SpecDiff;
        posPeak2SpecDiff = posPeak1SpecDiff;

        maxPeak1 = self->histSpecDiff[i];
        weightPeak1SpecDiff = self->histSpecDiff[i];
        posPeak1SpecDiff = binMid;
      } else if (self->histSpecDiff[i] > maxPeak2) {
        // Found new "second" peak.
        maxPeak2 = self->histSpecDiff[i];
        weightPeak2SpecDiff = self->histSpecDiff[i];
        posPeak2SpecDiff = binMid;
      }
    }

    // For spectrum flatness feature.
    useFeatureSpecFlat = 1;
    // Merge the two peaks if they are close.
    if ((fabs(posPeak2SpecFlat - posPeak1SpecFlat) <
         self->featureExtractionParams.limitPeakSpacingSpecFlat) &&
        (weightPeak2SpecFlat >
         self->featureExtractionParams.limitPeakWeightsSpecFlat *
             weightPeak1SpecFlat)) {
      weightPeak1SpecFlat += weightPeak2SpecFlat;
      posPeak1SpecFlat = 0.5f * (posPeak1SpecFlat + posPeak2SpecFlat);
    }
    // Reject if weight of peaks is not large enough, or peak value too small.
    if (weightPeak1SpecFlat <
            self->featureExtractionParams.thresWeightSpecFlat ||
        posPeak1SpecFlat < self->featureExtractionParams.thresPosSpecFlat) {
      useFeatureSpecFlat = 0;
    }
    // If selected, get the threshold.
    if (useFeatureSpecFlat == 1) {
      // Compute the threshold.
      self->priorModelPars[1] =
          self->featureExtractionParams.factor2ModelPars * posPeak1SpecFlat;
      // Check if value is within min/max range.
      if (self->priorModelPars[1] < self->featureExtractionParams.minSpecFlat) {
        self->priorModelPars[1] = self->featureExtractionParams.minSpecFlat;
      }
      if (self->priorModelPars[1] > self->featureExtractionParams.maxSpecFlat) {
        self->priorModelPars[1] = self->featureExtractionParams.maxSpecFlat;
      }
    }
    // Done with flatness feature.

    // For template feature.
    useFeatureSpecDiff = 1;
    // Merge the two peaks if they are close.
    if ((fabs(posPeak2SpecDiff - posPeak1SpecDiff) <
         self->featureExtractionParams.limitPeakSpacingSpecDiff) &&
        (weightPeak2SpecDiff >
         self->featureExtractionParams.limitPeakWeightsSpecDiff *
             weightPeak1SpecDiff)) {
      weightPeak1SpecDiff += weightPeak2SpecDiff;
      posPeak1SpecDiff = 0.5f * (posPeak1SpecDiff + posPeak2SpecDiff);
    }
    // Get the threshold value.
    self->priorModelPars[3] =
        self->featureExtractionParams.factor1ModelPars * posPeak1SpecDiff;
    // Reject if weight of peaks is not large enough.
    if (weightPeak1SpecDiff <
        self->featureExtractionParams.thresWeightSpecDiff) {
      useFeatureSpecDiff = 0;
    }
    // Check if value is within min/max range.
    if (self->priorModelPars[3] < self->featureExtractionParams.minSpecDiff) {
      self->priorModelPars[3] = self->featureExtractionParams.minSpecDiff;
    }
    if (self->priorModelPars[3] > self->featureExtractionParams.maxSpecDiff) {
      self->priorModelPars[3] = self->featureExtractionParams.maxSpecDiff;
    }
    // Done with spectral difference feature.

    // Don't use template feature if fluctuation of LRT feature is very low:
    // most likely just noise state.
    if (fluctLrt < self->featureExtractionParams.thresFluctLrt) {
      useFeatureSpecDiff = 0;
    }

    // Select the weights between the features.
    // self->priorModelPars[4] is weight for LRT: always selected.
    // self->priorModelPars[5] is weight for spectral flatness.
    // self->priorModelPars[6] is weight for spectral difference.
    featureSum = (float)(1 + useFeatureSpecFlat + useFeatureSpecDiff);
    self->priorModelPars[4] = 1.f / featureSum;
    self->priorModelPars[5] = ((float)useFeatureSpecFlat) / featureSum;
    self->priorModelPars[6] = ((float)useFeatureSpecDiff) / featureSum;

    // Set hists to zero for next update.
    if (self->modelUpdatePars[0] >= 1) {
      for (i = 0; i < HIST_PAR_EST; i++) {
        self->histLrt[i] = 0;
        self->histSpecFlat[i] = 0;
        self->histSpecDiff[i] = 0;
      }
    }
  }  // End of flag == 1.
}